

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

int compute_rd_thresh_factor(int qindex,aom_bit_depth_t bit_depth)

{
  int16_t iVar1;
  int in_ESI;
  double dVar2;
  double q;
  aom_bit_depth_t in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  double local_18;
  int local_4;
  
  if (in_ESI == 8) {
    iVar1 = av1_dc_quant_QTX(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                             in_stack_ffffffffffffffd8);
    local_18 = (double)(int)iVar1 / 4.0;
  }
  else if (in_ESI == 10) {
    iVar1 = av1_dc_quant_QTX(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                             in_stack_ffffffffffffffd8);
    local_18 = (double)(int)iVar1 / 16.0;
  }
  else {
    if (in_ESI != 0xc) {
      return -1;
    }
    iVar1 = av1_dc_quant_QTX(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                             in_stack_ffffffffffffffd8);
    local_18 = (double)(int)iVar1 / 64.0;
  }
  dVar2 = pow(local_18,1.25);
  if ((int)(dVar2 * 5.12) < 9) {
    local_4 = 8;
  }
  else {
    dVar2 = pow(local_18,1.25);
    local_4 = (int)(dVar2 * 5.12);
  }
  return local_4;
}

Assistant:

static int compute_rd_thresh_factor(int qindex, aom_bit_depth_t bit_depth) {
  double q;
  switch (bit_depth) {
    case AOM_BITS_8: q = av1_dc_quant_QTX(qindex, 0, AOM_BITS_8) / 4.0; break;
    case AOM_BITS_10:
      q = av1_dc_quant_QTX(qindex, 0, AOM_BITS_10) / 16.0;
      break;
    case AOM_BITS_12:
      q = av1_dc_quant_QTX(qindex, 0, AOM_BITS_12) / 64.0;
      break;
    default:
      assert(0 && "bit_depth should be AOM_BITS_8, AOM_BITS_10 or AOM_BITS_12");
      return -1;
  }
  // TODO(debargha): Adjust the function below.
  return AOMMAX((int)(pow(q, RD_THRESH_POW) * 5.12), 8);
}